

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomConnection::read(DomConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomConnectionHints *this_00;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_01;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  this_01 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
LAB_0016179e:
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_01);
      if (bVar1) goto LAB_001619cd;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) break;
      if (iVar2 == 5) {
LAB_001619cd:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return *(long *)(in_FS_OFFSET + 0x28);
      }
    }
    local_48.m_size = -0x5555555555555556;
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48 = (QStringView)QXmlStreamReader::name();
    Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"sender",6);
    other.m_data = local_60.ptr;
    other.m_size = local_60.size;
    iVar2 = QStringView::compare(&local_48,other,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    if (iVar2 == 0) {
      QXmlStreamReader::readElementText(&local_60,this_01,0);
      setElementSender(this,(QString *)&local_60);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"signal",6);
      other_00.m_data = local_60.ptr;
      other_00.m_size = local_60.size;
      iVar2 = QStringView::compare(&local_48,other_00,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(&local_60,this_01,0);
        setElementSignal(this,(QString *)&local_60);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"receiver",8);
        other_01.m_data = local_60.ptr;
        other_01.m_size = local_60.size;
        iVar2 = QStringView::compare(&local_48,other_01,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_60,this_01,0);
          setElementReceiver(this,(QString *)&local_60);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"slot",4);
          other_02.m_data = local_60.ptr;
          other_02.m_size = local_60.size;
          iVar2 = QStringView::compare(&local_48,other_02,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_60,this_01,0);
            setElementSlot(this,(QString *)&local_60);
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"hints",5);
            __nbytes_00 = 0;
            other_03.m_data = local_60.ptr;
            other_03.m_size = local_60.size;
            iVar2 = QStringView::compare(&local_48,other_03,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            if (iVar2 == 0) {
              this_00 = (DomConnectionHints *)operator_new(0x20);
              *(undefined8 *)this_00 = 0;
              (this_00->m_hint).d.d = (Data *)0x0;
              (this_00->m_hint).d.ptr = (DomConnectionHint **)0x0;
              (this_00->m_hint).d.size = 0;
              DomConnectionHints::read(this_00,__fd,__buf_00,__nbytes_00);
              setElementHints(this,this_00);
              goto LAB_0016179e;
            }
            local_78.a.m_size = 0x13;
            local_78.a.m_data = "Unexpected element ";
            local_78.b = &local_48;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      ((QString *)&local_60,&local_78);
            QXmlStreamReader::raiseError((QString *)this_01);
          }
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  } while( true );
}

Assistant:

void DomConnection::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"sender"_s, Qt::CaseInsensitive)) {
                setElementSender(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"signal"_s, Qt::CaseInsensitive)) {
                setElementSignal(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"receiver"_s, Qt::CaseInsensitive)) {
                setElementReceiver(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"slot"_s, Qt::CaseInsensitive)) {
                setElementSlot(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"hints"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnectionHints();
                v->read(reader);
                setElementHints(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}